

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_containers.h
# Opt level: O1

ThreadData * __thiscall
density_tests::
aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>_>::ThreadData>
::allocate(aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>_>::ThreadData>
           *this,size_t i_count)

{
  uintptr_t uint_pointer_1;
  ThreadData *pTVar1;
  uintptr_t uint_pointer;
  ThreadData *pTVar2;
  
  pTVar1 = (ThreadData *)operator_new(i_count * 0x1440 + 0x40);
  *(ThreadData **)(((ulong)pTVar1 & 0xffffffffffffffc0) + 0x38) = pTVar1;
  pTVar2 = (ThreadData *)(((ulong)pTVar1 & 0xffffffffffffffc0) + 0x40);
  if ((pTVar2 < pTVar1) ||
     (&pTVar1[i_count].m_final_stats.m_exceptions_during_consumes < pTVar2 + i_count)) {
    detail::assert_failed<>
              ("user_block >= complete_block && address_add(user_block, i_size) <= address_add(complete_block, actual_size)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
               ,0x1e5);
  }
  return pTVar2;
}

Assistant:

TYPE * allocate(std::size_t i_count)
        {
            return static_cast<TYPE *>(
              density::aligned_allocate(i_count * sizeof(TYPE), alignof(TYPE)));
        }